

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge.hpp
# Opt level: O3

pair<const_unsigned_long_&,_const_unsigned_long_&> Disa::order_edge_vertex(Edge *edge)

{
  Edge *pEVar1;
  ostream *poVar2;
  source_location *in_RCX;
  pair<const_unsigned_long_&,_const_unsigned_long_&> pVar3;
  undefined **local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (edge == (Edge *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_38 = &PTR_s__workspace_llm4binary_github_lic_0014fc18;
    console_format_abi_cxx11_(&local_30,(Disa *)0x0,(Log_Level)&local_38,in_RCX);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_30._M_dataplus._M_p,local_30._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Parsed edge point is null.",0x1a);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_30);
    exit(1);
  }
  pEVar1 = (Edge *)&edge->second;
  if (edge->first < edge->second) {
    pEVar1 = edge;
    edge = (Edge *)&edge->second;
  }
  pVar3.second = &edge->first;
  pVar3.first = &pEVar1->first;
  return pVar3;
}

Assistant:

constexpr std::pair<const std::size_t&, const std::size_t&> order_edge_vertex(const Edge* edge) {
  ASSERT_DEBUG(edge != nullptr, "Parsed edge point is null.");
  return edge->first < edge->second ? std::pair<const std::size_t&, const std::size_t&>({edge->first, edge->second})
                                    : std::pair<const std::size_t&, const std::size_t&>({edge->second, edge->first});
}